

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::dispatch_error::dispatch_error
          (dispatch_error *this,Function_Params *t_parameters,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,string *t_desc)

{
  string *t_desc_local;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *t_functions_local;
  Function_Params *t_parameters_local;
  dispatch_error *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)t_desc);
  *(undefined ***)this = &PTR__dispatch_error_00879bb8;
  Function_Params::to_vector(&this->parameters,t_parameters);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&this->functions,t_functions);
  return;
}

Assistant:

dispatch_error(const Function_Params &t_parameters, std::vector<Const_Proxy_Function> t_functions, const std::string &t_desc)
          : std::runtime_error(t_desc)
          , parameters(t_parameters.to_vector())
          , functions(std::move(t_functions)) {
      }